

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9AbsCreate(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *pGVar1;
  bool bVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  char *pcVar5;
  
  bVar2 = false;
  Extra_UtilGetoptReset();
  while (iVar3 = Extra_UtilGetopt(argc,argv,"vh"), iVar3 == 0x76) {
    bVar2 = (bool)(bVar2 ^ 1);
  }
  if (iVar3 == -1) {
    pGVar1 = pAbc->pGia;
    if (pGVar1 != (Gia_Man_t *)0x0) {
      iVar3 = pGVar1->nRegs;
      if ((long)iVar3 == 0) {
        pcVar5 = "The network is combinational.\n";
      }
      else if (pGVar1->vFlopClasses == (Vec_Int_t *)0x0) {
        pVVar4 = Vec_IntAlloc(iVar3);
        pVVar4->nSize = iVar3;
        if (pVVar4->pArray != (int *)0x0) {
          memset(pVVar4->pArray,0,(long)iVar3 << 2);
        }
        pAbc->pGia->vFlopClasses = pVVar4;
        if (globalUtilOptind + 1 == argc) {
          pcVar5 = argv[globalUtilOptind];
          while( true ) {
            pcVar5 = strtok(pcVar5," ,");
            if (pcVar5 == (char *)0x0) {
              return 0;
            }
            iVar3 = atoi(pcVar5);
            if ((iVar3 < 0) || (pAbc->pGia->nRegs <= iVar3)) break;
            Vec_IntWriteEntry(pAbc->pGia->vFlopClasses,iVar3,1);
            pcVar5 = (char *)0x0;
          }
          __assert_fail("iFlop >= 0 && iFlop < Gia_ManRegNum(pAbc->pGia)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abc.c"
                        ,0xb66e,"int Abc_CommandAbc9AbsCreate(Abc_Frame_t *, int, char **)");
        }
        pcVar5 = "Flop list should be specified on the command line.\n";
      }
      else {
        pcVar5 = "Abstraction flop map is already defined.\n";
      }
      Abc_Print(-1,pcVar5);
      return 0;
    }
    pcVar5 = "Abc_CommandAbc9AbsCreate(): There is no AIG.\n";
    iVar3 = -1;
  }
  else {
    iVar3 = -2;
    Abc_Print(-2,"usage: &abs_create [-vh] <comma-separated_list_of_zero-based_flop_ids>\n");
    Abc_Print(-2,"\t        creates new flop map by reading user\'s input\n");
    pcVar5 = "yes";
    if (!bVar2) {
      pcVar5 = "no";
    }
    Abc_Print(-2,"\t-v    : toggle printing verbose information [default = %s]\n",pcVar5);
    pcVar5 = "\t-h    : print the command usage\n";
  }
  Abc_Print(iVar3,pcVar5);
  return 1;
}

Assistant:

int Abc_CommandAbc9AbsCreate( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    //Gia_Man_t * pTemp = NULL;
    char * pStr, * pFlopNum;
    int c, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "vh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9AbsCreate(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "The network is combinational.\n" );
        return 0;
    }
    if ( pAbc->pGia->vFlopClasses != NULL )
    {
        Abc_Print( -1, "Abstraction flop map is already defined.\n" );
        return 0;
    }
    pAbc->pGia->vFlopClasses = Vec_IntStart( Gia_ManRegNum(pAbc->pGia) );
    // read the flop list
    if ( argc != globalUtilOptind + 1 )
    {
        Abc_Print( -1, "Flop list should be specified on the command line.\n" );
        return 0;
    }
    pStr = argv[globalUtilOptind];
    // parse flop list
    pFlopNum = strtok( pStr, " ," );
    while ( pFlopNum )
    {
        int iFlop = atoi(pFlopNum);
        assert( iFlop >= 0 && iFlop < Gia_ManRegNum(pAbc->pGia) );
        Vec_IntWriteEntry( pAbc->pGia->vFlopClasses, iFlop, 1 );
        pFlopNum = strtok( NULL, " ," );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: &abs_create [-vh] <comma-separated_list_of_zero-based_flop_ids>\n" );
    Abc_Print( -2, "\t        creates new flop map by reading user's input\n" );
    Abc_Print( -2, "\t-v    : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}